

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

void __thiscall senjo::TestCommandHandle::Execute(TestCommandHandle *this)

{
  ChessEngine *pCVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  Output *pOVar7;
  int *piVar8;
  undefined4 extraout_var;
  char *pcVar9;
  long lVar10;
  size_type sVar11;
  double dVar12;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  exception *e;
  int local_42cc;
  Output local_42c8;
  int local_42bc;
  Output local_42b8;
  double local_42b0;
  Output local_42a8;
  double local_42a0;
  Output local_4298;
  double local_4290;
  Output local_4288;
  double local_4280;
  Output local_4278;
  Output local_4270;
  double local_4268;
  Output local_4260;
  double local_4258;
  Output local_4250;
  Output local_4248;
  undefined1 local_4240 [8];
  string bestmove;
  Output local_4220;
  _Base_ptr local_4218;
  undefined1 local_4210;
  undefined1 local_4208 [8];
  string coord_1;
  int local_41e4;
  string coord;
  char *end;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  best;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avoid;
  char *next;
  Output local_4138;
  int *local_4130;
  char *f;
  Output local_4120;
  undefined1 local_4118 [8];
  MoveFinder moveFinder;
  FILE *fp;
  uint64_t totalTime;
  uint64_t totalQnodes;
  uint64_t totalNodes;
  uint64_t time;
  uint64_t qnodes;
  uint64_t nodes;
  int totalSeldepth;
  int totalDepth;
  int tested;
  int seldepth;
  int positions;
  int passed;
  int minSeldepth;
  int minSearchDepth;
  int maxSeldepth;
  int maxSearchDepth;
  int line;
  int depth;
  char fen [16384];
  Output local_30 [3];
  Output local_18;
  TestCommandHandle *local_10;
  TestCommandHandle *this_local;
  
  local_10 = this;
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output(&local_18,InfoPrefix);
    Output::operator<<(&local_18,(char (*) [34])"Engine not set for \'test\' command");
    Output::~Output(&local_18);
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      maxSearchDepth = 0;
      maxSeldepth = 0;
      minSearchDepth = 0;
      minSeldepth = 0;
      passed = -1;
      positions = -1;
      seldepth = 0;
      tested = 0;
      totalDepth = 0;
      totalSeldepth = 0;
      nodes._4_4_ = 0;
      nodes._0_4_ = 0;
      qnodes = 0;
      time = 0;
      totalNodes = 0;
      totalQnodes = 0;
      totalTime = 0;
      fp = (FILE *)0x0;
      moveFinder.castleShort[1].to.sqr = 0;
      moveFinder.ep.sqr = 0;
      MoveFinder::MoveFinder((MoveFinder *)local_4118);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      moveFinder._112_8_ = fopen(pcVar6,"r");
      if ((FILE *)moveFinder._112_8_ == (FILE *)0x0) {
        Output::Output(&local_4120,InfoPrefix);
        pOVar7 = Output::operator<<(&local_4120,(char (*) [14])"Cannot open \'");
        pOVar7 = Output::operator<<(pOVar7,&this->fileName);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [4])"\': ");
        piVar8 = __errno_location();
        f = strerror(*piVar8);
        Output::operator<<(pOVar7,&f);
        Output::~Output(&local_4120);
      }
      else {
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x1e])();
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x22])();
        while (pcVar6 = fgets((char *)&line,0x4000,(FILE *)moveFinder._112_8_),
              pcVar6 != (char *)0x0) {
          maxSeldepth = maxSeldepth + 1;
          local_4130 = &line;
          pcVar6 = NextWord((char **)&local_4130);
          if (((*pcVar6 != '\0') && ((char)*local_4130 != '#')) &&
             ((tested = tested + 1, this->skipCount == 0 || (this->skipCount < tested)))) {
            Output::Output(&local_4138,InfoPrefix);
            pOVar7 = Output::operator<<(&local_4138,(char (*) [10])"--- Test ");
            totalSeldepth = totalSeldepth + 1;
            pOVar7 = Output::operator<<(pOVar7,&totalSeldepth);
            pOVar7 = Output::operator<<(pOVar7,(char (*) [10])0x1791de);
            pOVar7 = Output::operator<<(pOVar7,&maxSeldepth);
            next._7_1_ = 0x20;
            pOVar7 = Output::operator<<(pOVar7,(char *)((long)&next + 7));
            Output::operator<<(pOVar7,(char **)&local_4130);
            Output::~Output(&local_4138);
            NormalizeString((char **)&local_4130);
            pCVar1 = (this->super_BackgroundCommand).engine;
            iVar3 = (*pCVar1->_vptr_ChessEngine[9])(pCVar1,local_4130);
            if (((int *)CONCAT44(extraout_var,iVar3) == (int *)0x0) ||
               (bVar2 = MoveFinder::LoadFEN((MoveFinder *)local_4118,(char *)local_4130), !bVar2))
            break;
            local_4130 = (int *)CONCAT44(extraout_var,iVar3);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&end);
            while( true ) {
              bVar2 = false;
              if (local_4130 != (int *)0x0) {
                pcVar6 = NextWord((char **)&local_4130);
                bVar2 = *pcVar6 != '\0';
              }
              if (!bVar2) break;
              pcVar6 = strchr((char *)local_4130,0x3b);
              if (pcVar6 != (char *)0x0) {
                *pcVar6 = '\0';
              }
              iVar3 = strncmp((char *)local_4130,"am ",3);
              if (iVar3 == 0) {
                local_4130 = (int *)((long)local_4130 + 3);
                do {
                  pcVar9 = NextWord((char **)&local_4130);
                  if (*pcVar9 == '\0') break;
                  MoveFinder::ToCoordinates_abi_cxx11_
                            ((MoveFinder *)&stack0xffffffffffffbe30,(char **)local_4118);
                  lVar10 = std::__cxx11::string::size();
                  if (lVar10 == 0) {
                    local_41e4 = 7;
                  }
                  else {
                    std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (value_type *)&stack0xffffffffffffbe30);
                    local_41e4 = 0;
                  }
                  std::__cxx11::string::~string((string *)&stack0xffffffffffffbe30);
                } while (local_41e4 == 0);
              }
              else {
                iVar3 = strncmp((char *)local_4130,"bm ",3);
                if (iVar3 == 0) {
                  local_4130 = (int *)((long)local_4130 + 3);
                  do {
                    pcVar9 = NextWord((char **)&local_4130);
                    if (*pcVar9 == '\0') break;
                    MoveFinder::ToCoordinates_abi_cxx11_
                              ((MoveFinder *)local_4208,(char **)local_4118);
                    lVar10 = std::__cxx11::string::size();
                    if (lVar10 == 0) {
                      local_41e4 = 9;
                    }
                    else {
                      pVar13 = std::
                               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&end,(value_type *)local_4208);
                      local_4218 = (_Base_ptr)pVar13.first._M_node;
                      local_4210 = pVar13.second;
                      local_41e4 = 0;
                    }
                    std::__cxx11::string::~string((string *)local_4208);
                  } while (local_41e4 == 0);
                }
              }
              if (pcVar6 == (char *)0x0) break;
              local_4130 = (int *)(pcVar6 + 1);
            }
            bVar2 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if ((bVar2) &&
               (bVar2 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&end), bVar2)) {
              Output::Output(&local_4220,InfoPrefix);
              pOVar7 = Output::operator<<(&local_4220,(char (*) [15])"error at line ");
              pOVar7 = Output::operator<<(pOVar7,&maxSeldepth);
              Output::operator<<(pOVar7,(char (*) [35])", no best or avoid moves specified");
              Output::~Output(&local_4220);
              local_41e4 = 3;
            }
            else {
              if ((this->noClear & 1U) == 0) {
                (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xe])();
              }
              if ((this->printBoard & 1U) != 0) {
                (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xc])();
              }
              ChessEngine::Go((ChessEngine *)local_4240,(int)(this->super_BackgroundCommand).engine,
                              this->maxDepth,0,this->maxTime,0,0,0,(string *)0x0);
              Output::Output(&local_4248,NoPrefix);
              pOVar7 = Output::operator<<(&local_4248,(char (*) [10])"bestmove ");
              Output::operator<<(pOVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_4240);
              Output::~Output(&local_4248);
              pCVar1 = (this->super_BackgroundCommand).engine;
              (*pCVar1->_vptr_ChessEngine[0x10])
                        (pCVar1,&maxSearchDepth,&totalDepth,&qnodes,&time,&totalNodes,0,0,0);
              uVar5 = std::__cxx11::string::empty();
              if ((((uVar5 & 1) == 0) &&
                  ((sVar11 = std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&end), sVar11 == 0 ||
                   (sVar11 = std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&end,(key_type *)local_4240), sVar11 != 0)))) &&
                 ((sVar11 = std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count),
                  sVar11 == 0 ||
                  (sVar11 = std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    (key_type *)local_4240), sVar11 == 0)))) {
                seldepth = seldepth + 1;
                Output::Output(&local_4260,InfoPrefix);
                pOVar7 = Output::operator<<(&local_4260,(char (*) [18])"--- Passed. line ");
                pOVar7 = Output::operator<<(pOVar7,&maxSeldepth);
                pOVar7 = Output::operator<<(pOVar7,(char (*) [3])0x1785fb);
                local_4268 = Percent(seldepth,totalSeldepth);
                pOVar7 = Output::operator<<(pOVar7,&local_4268);
                pOVar7 = Output::operator<<(pOVar7,(char (*) [4])"%) ");
                Output::operator<<(pOVar7,(char **)&local_4130);
                Output::~Output(&local_4260);
              }
              else {
                Output::Output(&local_4250,InfoPrefix);
                pOVar7 = Output::operator<<(&local_4250,(char (*) [18])"--- FAILED! line ");
                pOVar7 = Output::operator<<(pOVar7,&maxSeldepth);
                pOVar7 = Output::operator<<(pOVar7,(char (*) [3])0x1785fb);
                local_4258 = Percent(seldepth,totalSeldepth);
                pOVar7 = Output::operator<<(pOVar7,&local_4258);
                pOVar7 = Output::operator<<(pOVar7,(char (*) [4])"%) ");
                Output::operator<<(pOVar7,(char **)&local_4130);
                Output::~Output(&local_4250);
              }
              if (minSearchDepth < maxSearchDepth) {
                minSearchDepth = maxSearchDepth;
              }
              if ((passed < 0) || (maxSearchDepth < passed)) {
                passed = maxSearchDepth;
              }
              if (minSeldepth < totalDepth) {
                minSeldepth = totalDepth;
              }
              if ((positions < 0) || (totalDepth < positions)) {
                positions = totalDepth;
              }
              nodes._4_4_ = nodes._4_4_ + maxSearchDepth;
              totalQnodes = totalQnodes + qnodes;
              totalTime = totalTime + time;
              nodes._0_4_ = (int)nodes + totalDepth;
              fp = fp + totalNodes;
              uVar4 = (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x20])();
              if (((uVar4 & 1) == 0) && ((this->maxCount == 0 || (totalSeldepth < this->maxCount))))
              {
                local_41e4 = 0;
              }
              else {
                local_41e4 = 3;
              }
              std::__cxx11::string::~string((string *)local_4240);
            }
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&end);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&best._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if (local_41e4 != 0) break;
          }
        }
        Output::Output(&local_4270,InfoPrefix);
        pOVar7 = Output::operator<<(&local_4270,(char (*) [15])"--- Completed ");
        pOVar7 = Output::operator<<(pOVar7,&totalSeldepth);
        Output::operator<<(pOVar7,(char (*) [16])" test positions");
        Output::~Output(&local_4270);
        Output::Output(&local_4278,InfoPrefix);
        pOVar7 = Output::operator<<(&local_4278,(char (*) [15])"--- Passed    ");
        pOVar7 = Output::operator<<(pOVar7,&seldepth);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [10])" passed (");
        local_4280 = Percent(seldepth,totalSeldepth);
        pOVar7 = Output::operator<<(pOVar7,&local_4280);
        Output::operator<<(pOVar7,(char (*) [3])"%)");
        Output::~Output(&local_4278);
        Output::Output(&local_4288,InfoPrefix);
        pOVar7 = Output::operator<<(&local_4288,(char (*) [15])"--- Time      ");
        pOVar7 = Output::operator<<(pOVar7,(unsigned_long *)&fp);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [3])0x1785fb);
        local_4290 = Average((uint64_t)fp,(long)totalSeldepth);
        pOVar7 = Output::operator<<(pOVar7,&local_4290);
        Output::operator<<(pOVar7,(char (*) [6])" avg)");
        Output::~Output(&local_4288);
        Output::Output(&local_4298,InfoPrefix);
        pOVar7 = Output::operator<<(&local_4298,(char (*) [15])"--- Nodes     ");
        pOVar7 = Output::operator<<(pOVar7,&totalQnodes);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [3])0x1784a2);
        local_42a0 = Rate(totalQnodes / 1000,(uint64_t)fp);
        pOVar7 = Output::operator<<(pOVar7,&local_42a0);
        Output::operator<<(pOVar7,(char (*) [12])" KNodes/sec");
        Output::~Output(&local_4298);
        Output::Output(&local_42a8,InfoPrefix);
        pOVar7 = Output::operator<<(&local_42a8,(char (*) [15])"--- QNodes    ");
        pOVar7 = Output::operator<<(pOVar7,&totalTime);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [3])0x1785fb);
        local_42b0 = Percent(totalTime,totalQnodes);
        pOVar7 = Output::operator<<(pOVar7,&local_42b0);
        Output::operator<<(pOVar7,(char (*) [3])"%)");
        Output::~Output(&local_42a8);
        Output::Output(&local_42b8,InfoPrefix);
        pOVar7 = Output::operator<<(&local_42b8,(char (*) [15])"--- Depth     ");
        pOVar7 = Output::operator<<(pOVar7,&passed);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [7])" min, ");
        dVar12 = Average(nodes._4_4_,totalSeldepth);
        local_42bc = (int)dVar12;
        pOVar7 = Output::operator<<(pOVar7,&local_42bc);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [7])" avg, ");
        pOVar7 = Output::operator<<(pOVar7,&minSearchDepth);
        Output::operator<<(pOVar7,(char (*) [5])" max");
        Output::~Output(&local_42b8);
        Output::Output(&local_42c8,InfoPrefix);
        pOVar7 = Output::operator<<(&local_42c8,(char (*) [15])"--- SelDepth  ");
        pOVar7 = Output::operator<<(pOVar7,&positions);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [7])" min, ");
        dVar12 = Average((int)nodes,totalSeldepth);
        local_42cc = (int)dVar12;
        pOVar7 = Output::operator<<(pOVar7,&local_42cc);
        pOVar7 = Output::operator<<(pOVar7,(char (*) [7])" avg, ");
        pOVar7 = Output::operator<<(pOVar7,&minSeldepth);
        Output::operator<<(pOVar7,(char (*) [5])" max");
        Output::~Output(&local_42c8);
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x23])();
        if (moveFinder._112_8_ != 0) {
          fclose((FILE *)moveFinder._112_8_);
        }
      }
    }
    else {
      Output::Output(local_30,InfoPrefix);
      Output::operator<<(local_30,(char (*) [36])"FileName not set for \'test\' command");
      Output::~Output(local_30);
    }
  }
  return;
}

Assistant:

void TestCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'test' command";
    return;
  }

  if (fileName.empty()) {
    Output() << "FileName not set for 'test' command";
    return;
  }

  char     fen[16384];
  int      depth = 0;
  int      line = 0;
  int      maxSearchDepth = 0;
  int      maxSeldepth = 0;
  int      minSearchDepth = -1;
  int      minSeldepth = -1;
  int      passed = 0;
  int      positions = 0;
  int      seldepth = 0;
  int      tested = 0;
  int      totalDepth = 0;
  int      totalSeldepth = 0;
  uint64_t nodes = 0;
  uint64_t qnodes = 0;
  uint64_t time = 0;
  uint64_t totalNodes = 0;
  uint64_t totalQnodes = 0;
  uint64_t totalTime = 0;
  FILE*    fp = NULL;

  try {
    MoveFinder moveFinder;

    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    engine->ClearStopFlags();
    engine->ResetStatsTotals();

    while (fgets(fen, sizeof(fen), fp)) {
      line++;

      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if (skipCount && (positions <= skipCount)) {
        continue;
      }

      Output() << "--- Test " << (++tested) << " at line " << line << ' ' << f;
      NormalizeString(f);
      const char* next = engine->SetPosition(f);
      if (!next || !moveFinder.LoadFEN(f)) {
        break;
      }
      f += (next - f);

      // consume 'am' and 'bm' parameters
      std::set<std::string> avoid;
      std::set<std::string> best;
      while (f && *NextWord(f)) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        if (!strncmp(f, "am ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              avoid.insert(coord);
            }
            else {
              break;
            }
          }
        }
        else if (!strncmp(f, "bm ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              best.insert(coord);
            }
            else {
              break;
            }
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if (avoid.empty() && best.empty()) {
        Output() << "error at line " << line
                 << ", no best or avoid moves specified";
        break;
      }

      if (!noClear) {
        engine->ClearSearchData();
      }
      if (printBoard) {
        engine->PrintBoard();
      }

      const std::string bestmove = engine->Go(maxDepth, 0, maxTime);
      Output(Output::NoPrefix) << "bestmove " << bestmove;

      engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &time);
      if (bestmove.empty() ||
          (best.size() && !best.count(bestmove)) ||
          (avoid.size() && avoid.count(bestmove)))
      {
        Output() << "--- FAILED! line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }
      else {
        passed++;
        Output() << "--- Passed. line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }

      if (depth > maxSearchDepth) {
        maxSearchDepth = depth;
      }
      if ((minSearchDepth < 0) || (depth < minSearchDepth)) {
        minSearchDepth = depth;
      }
      if (seldepth > maxSeldepth) {
        maxSeldepth = seldepth;
      }
      if ((minSeldepth < 0) || (seldepth < minSeldepth)) {
        minSeldepth = seldepth;
      }
      totalDepth += depth;
      totalNodes += nodes;
      totalQnodes += qnodes;
      totalSeldepth += seldepth;
      totalTime += time;

      if (engine->StopRequested() || (maxCount && (tested >= maxCount))) {
        break;
      }
    }

    Output() << "--- Completed " << tested << " test positions";
    Output() << "--- Passed    " << passed << " passed ("
             << Percent(passed, tested) << "%)";
    Output() << "--- Time      " << totalTime << " ("
             << Average(totalTime, static_cast<uint64_t>(tested)) << " avg)";
    Output() << "--- Nodes     " << totalNodes << ", "
             << Rate((totalNodes / 1000), totalTime) << " KNodes/sec";
    Output() << "--- QNodes    " << totalQnodes << " ("
             << Percent(totalQnodes, totalNodes) << "%)";
    Output() << "--- Depth     " << minSearchDepth << " min, "
             << static_cast<int>(Average(totalDepth, tested)) << " avg, "
             << maxSearchDepth << " max";
    Output() << "--- SelDepth  " << minSeldepth << " min, "
             << static_cast<int>(Average(totalSeldepth, tested)) << " avg, "
             << maxSeldepth << " max";

    engine->ShowStatsTotals();
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}